

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O3

void kj::_::anon_unknown_0::RemovePlus(char *buffer)

{
  char *__s;
  size_t sVar1;
  
  for (__s = strchr(buffer,0x2b); __s != (char *)0x0; __s = strchr(__s,0x2b)) {
    sVar1 = strlen(__s + 1);
    memmove(__s,__s + 1,sVar1 + 1);
  }
  return;
}

Assistant:

void RemovePlus(char* buffer) {
  // Remove any + characters because they are redundant and ugly.

  for (;;) {
    buffer = strchr(buffer, '+');
    if (buffer == NULL) {
      return;
    }
    memmove(buffer, buffer + 1, strlen(buffer + 1) + 1);
  }
}